

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl::commitFlips(Private_Impl *this)

{
  int iVar1;
  int iVar2;
  MMAL_STATUS_T MVar3;
  MMAL_PARAMETER_MIRROR_T mirror;
  MMAL_PARAMETER_HEADER_T local_18;
  uint local_10;
  
  local_18.id = 0x1000f;
  local_18.size = 0xc;
  local_10 = 0;
  iVar1 = (this->State).hflip;
  iVar2 = (this->State).vflip;
  if (iVar1 != 0 || iVar2 != 0) {
    local_10 = 1;
    if (iVar1 != 0) {
      local_10 = (iVar1 != 0 && iVar2 != 0) | 2;
    }
  }
  MVar3 = mmal_port_parameter_set(*((this->State).camera_component)->output,&local_18);
  if (((MVar3 != MMAL_SUCCESS) ||
      (MVar3 = mmal_port_parameter_set(((this->State).camera_component)->output[1],&local_18),
      MVar3 != MMAL_SUCCESS)) ||
     (MVar3 = mmal_port_parameter_set(((this->State).camera_component)->output[2],&local_18),
     MVar3 != MMAL_SUCCESS)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"commitFlips",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": Failed to set horizontal/vertical flip parameter.\n",0x34);
  }
  return;
}

Assistant:

void Private_Impl::commitFlips() {
            MMAL_PARAMETER_MIRROR_T mirror = {{MMAL_PARAMETER_MIRROR, sizeof ( MMAL_PARAMETER_MIRROR_T ) }, MMAL_PARAM_MIRROR_NONE};
            if ( State.hflip && State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_BOTH;
            else if ( State.hflip )
                mirror.value = MMAL_PARAM_MIRROR_HORIZONTAL;
            else if ( State.vflip )
                mirror.value = MMAL_PARAM_MIRROR_VERTICAL;
            if ( mmal_port_parameter_set ( State.camera_component->output[0], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[1], &mirror.hdr ) != MMAL_SUCCESS ||
                    mmal_port_parameter_set ( State.camera_component->output[2], &mirror.hdr ) )
                cout << __func__ << ": Failed to set horizontal/vertical flip parameter.\n";
        }